

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void com_deblock_lcu_row(com_core_t *core,int lcu_y)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  com_seqh_t *pcVar9;
  com_pic_header_t *pcVar10;
  com_pic_t *pcVar11;
  s8 *psVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ushort *puVar24;
  char *pcVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  int local_f8;
  int local_f4;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  pel *local_c0;
  pel *local_b8;
  
  pcVar9 = core->seqhdr;
  pcVar10 = core->pichdr;
  pcVar11 = core->pic;
  iVar3 = pcVar9->pic_width_in_lcu;
  iVar4 = pcVar9->i_scu;
  iVar5 = pcVar11->stride_luma;
  iVar6 = pcVar11->stride_chroma;
  bVar14 = (char)pcVar9->bit_depth_internal - 8;
  iVar7 = pcVar10->fixed_picture_qp_flag;
  uVar34 = pcVar9->max_cuwh * lcu_y;
  iVar20 = pcVar9->max_cuwh + uVar34;
  if (pcVar9->pic_height <= iVar20) {
    iVar20 = pcVar9->pic_height;
  }
  iVar8 = pcVar9->bit_depth_2_qp_offset;
  if (iVar7 != 0) {
    iVar21 = (core->map).map_qp[lcu_y * iVar3] - iVar8;
    iVar29 = iVar21 * 2 >> 1;
    iVar15 = pcVar10->alpha_c_offset;
    uVar30 = iVar29 + iVar15;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar33 = 0;
    uVar23 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar23 = uVar33;
    }
    iVar13 = pcVar10->beta_offset;
    local_f4 = (uint)""[uVar23] << (bVar14 & 0x1f);
    uVar30 = iVar29 + iVar13;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar23 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar23 = uVar33;
    }
    local_f8 = (uint)""[uVar23] << (bVar14 & 0x1f);
    uVar31 = pcVar10->chroma_quant_param_delta_cb + iVar21;
    uVar30 = uVar31;
    if (-1 < (int)uVar31) {
      uVar23 = 0x3f;
      if (uVar31 < 0x3f) {
        uVar23 = (ulong)uVar31;
      }
      uVar30 = (uint)""[uVar23];
    }
    iVar29 = uVar30 + iVar8;
    if (iVar29 < 1) {
      iVar29 = 0;
    }
    uVar30 = (iVar29 - iVar8) + iVar15;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar23 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar23 = uVar33;
    }
    local_dc = (uint)""[uVar23] << (bVar14 & 0x1f);
    uVar30 = (iVar29 - iVar8) + iVar13;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar23 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar23 = uVar33;
    }
    local_e0 = (uint)""[uVar23] << (bVar14 & 0x1f);
    uVar22 = iVar21 + pcVar10->chroma_quant_param_delta_cr;
    uVar30 = uVar22;
    if (-1 < (int)uVar22) {
      uVar23 = 0x3f;
      if (uVar22 < 0x3f) {
        uVar23 = (ulong)uVar22;
      }
      uVar30 = (uint)""[uVar23];
    }
    uVar23 = 0;
    iVar21 = uVar30 + iVar8;
    if ((int)(uVar30 + iVar8) < 1) {
      iVar21 = 0;
    }
    uVar30 = (iVar21 - iVar8) + iVar15;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar33 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar33 = uVar23;
    }
    local_e4 = (uint)""[uVar33] << (bVar14 & 0x1f);
    uVar30 = (iVar21 - iVar8) + iVar13;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar33 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar33 = uVar23;
    }
    local_e8 = (uint)""[uVar33] << (bVar14 & 0x1f);
    if (-1 < (int)uVar31) {
      uVar33 = (ulong)uVar31;
      if (0x3e < uVar31) {
        uVar33 = 0x3f;
      }
      uVar31 = (uint)""[uVar33];
    }
    iVar21 = uVar31 + iVar8;
    if ((int)(uVar31 + iVar8) < 1) {
      iVar21 = 0;
    }
    uVar30 = (iVar21 - iVar8) + iVar15;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar33 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar33 = uVar23;
    }
    local_cc = (uint)""[uVar33] << (bVar14 & 0x1f);
    uVar30 = (iVar21 - iVar8) + iVar13;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar33 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar33 = uVar23;
    }
    local_d0 = (uint)""[uVar33] << (bVar14 & 0x1f);
    if (-1 < (int)uVar22) {
      uVar23 = (ulong)uVar22;
      if (0x3e < uVar22) {
        uVar23 = 0x3f;
      }
      uVar22 = (uint)""[uVar23];
    }
    iVar21 = uVar22 + iVar8;
    if (iVar21 < 1) {
      iVar21 = 0;
    }
    uVar30 = iVar15 + (iVar21 - iVar8);
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar23 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar23 = 0;
    }
    local_d4 = (uint)""[uVar23] << (bVar14 & 0x1f);
    uVar30 = (iVar21 - iVar8) + iVar13;
    if (0x3e < (int)uVar30) {
      uVar30 = 0x3f;
    }
    uVar23 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar23 = 0;
    }
    local_d8 = (uint)""[uVar23] << (bVar14 & 0x1f);
  }
  local_b8 = pcVar11->y + (long)(int)uVar34 * (long)iVar5;
  local_c0 = pcVar11->uv + (long)((int)uVar34 >> 1) * (long)iVar6;
  iVar15 = iVar8 * -2 + 1;
  local_c4 = local_f4;
  local_c8 = local_f8;
  do {
    uVar30 = 0x3f;
    if (iVar20 <= (int)uVar34) {
      return;
    }
    psVar12 = (core->map).map_qp;
    bVar1 = (byte)pcVar9->log2_max_cuwh;
    pcVar25 = psVar12 + ((int)uVar34 >> (bVar1 & 0x1f)) * iVar3;
    pcVar17 = psVar12 + ((int)(uVar34 - 8) >> (bVar1 & 0x1f)) * iVar3;
    if (iVar7 == 0) {
      iVar13 = (int)*pcVar25;
      iVar21 = pcVar10->alpha_c_offset;
      iVar29 = pcVar10->beta_offset;
      iVar27 = (int)pcVar10->chroma_quant_param_delta_cb;
      if (uVar34 == 0) {
        iVar13 = iVar13 - iVar8;
        uVar31 = iVar27 + iVar13;
      }
      else {
        iVar26 = (int)*pcVar17;
        iVar32 = iVar15 + iVar13 + iVar26 >> 1;
        uVar31 = iVar32 + iVar21;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        uVar23 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          uVar23 = 0;
        }
        local_f4 = (uint)""[uVar23] << (bVar14 & 0x1f);
        uVar31 = iVar32 + iVar29;
        if (0x3e < (int)uVar31) {
          uVar31 = 0x3f;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        local_f8 = (uint)""[uVar31] << (bVar14 & 0x1f);
        iVar13 = iVar13 - iVar8;
        uVar31 = iVar13 + iVar27;
        uVar22 = uVar31;
        if (-1 < (int)uVar31) {
          uVar22 = uVar30;
          if (uVar31 < 0x3f) {
            uVar22 = uVar31;
          }
          uVar22 = (uint)""[uVar22];
        }
        iVar26 = iVar26 - iVar8;
        uVar28 = iVar27 + iVar26;
        if (-1 < (int)uVar28) {
          if (0x3e < uVar28) {
            uVar28 = uVar30;
          }
          uVar28 = (uint)""[uVar28];
        }
        iVar27 = uVar22 + iVar8;
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        iVar32 = uVar28 + iVar8;
        if (iVar32 < 1) {
          iVar32 = 0;
        }
        iVar27 = (iVar32 + iVar27 + 1U >> 1) - iVar8;
        uVar22 = iVar27 + iVar21;
        if (0x3e < (int)uVar22) {
          uVar22 = 0x3f;
        }
        uVar23 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar23 = 0;
        }
        local_dc = (uint)""[uVar23] << (bVar14 & 0x1f);
        uVar22 = iVar27 + iVar29;
        if (0x3e < (int)uVar22) {
          uVar22 = 0x3f;
        }
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        local_e0 = (uint)""[uVar22] << (bVar14 & 0x1f);
        uVar22 = iVar13 + pcVar10->chroma_quant_param_delta_cr;
        if (-1 < (int)uVar22) {
          if (0x3e < uVar22) {
            uVar22 = uVar30;
          }
          uVar22 = (uint)""[uVar22];
        }
        uVar28 = iVar26 + pcVar10->chroma_quant_param_delta_cr;
        if (-1 < (int)uVar28) {
          if (0x3e < uVar28) {
            uVar28 = uVar30;
          }
          uVar28 = (uint)""[uVar28];
        }
        iVar27 = uVar22 + iVar8;
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        iVar26 = uVar28 + iVar8;
        if (iVar26 < 1) {
          iVar26 = 0;
        }
        iVar27 = (iVar26 + iVar27 + 1U >> 1) - iVar8;
        uVar22 = iVar27 + iVar21;
        if (0x3e < (int)uVar22) {
          uVar22 = 0x3f;
        }
        uVar23 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar23 = 0;
        }
        local_e4 = (uint)""[uVar23] << (bVar14 & 0x1f);
        uVar22 = iVar27 + iVar29;
        if (0x3e < (int)uVar22) {
          uVar22 = 0x3f;
        }
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        local_e8 = (uint)""[uVar22] << (bVar14 & 0x1f);
      }
      iVar27 = iVar13 * 2 >> 1;
      uVar22 = iVar21 + iVar27;
      if (0x3e < (int)uVar22) {
        uVar22 = 0x3f;
      }
      uVar23 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar23 = 0;
      }
      local_c4 = (uint)""[uVar23] << (bVar14 & 0x1f);
      uVar22 = iVar27 + iVar29;
      if (0x3e < (int)uVar22) {
        uVar22 = 0x3f;
      }
      uVar23 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar23 = 0;
      }
      local_c8 = (uint)""[uVar23] << (bVar14 & 0x1f);
      if (-1 < (int)uVar31) {
        if (0x3e < uVar31) {
          uVar31 = uVar30;
        }
        uVar31 = (uint)""[uVar31];
      }
      iVar27 = uVar31 + iVar8;
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      uVar31 = (iVar27 - iVar8) + iVar21;
      if (0x3e < (int)uVar31) {
        uVar31 = 0x3f;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      local_cc = (uint)""[uVar31] << (bVar14 & 0x1f);
      uVar31 = (iVar27 - iVar8) + iVar29;
      if (0x3e < (int)uVar31) {
        uVar31 = 0x3f;
      }
      uVar22 = 0;
      if ((int)uVar31 < 1) {
        uVar31 = uVar22;
      }
      local_d0 = (uint)""[uVar31] << (bVar14 & 0x1f);
      uVar31 = iVar13 + pcVar10->chroma_quant_param_delta_cr;
      if (-1 < (int)uVar31) {
        if (0x3e < uVar31) {
          uVar31 = uVar30;
        }
        uVar31 = (uint)""[uVar31];
      }
      iVar13 = uVar31 + iVar8;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      uVar31 = iVar21 + (iVar13 - iVar8);
      if (0x3e < (int)uVar31) {
        uVar31 = 0x3f;
      }
      if ((int)uVar31 < 1) {
        uVar31 = uVar22;
      }
      local_d4 = (uint)""[uVar31] << (bVar14 & 0x1f);
      uVar31 = (iVar13 - iVar8) + iVar29;
      if (0x3e < (int)uVar31) {
        uVar31 = uVar30;
      }
      if ((int)uVar31 < 1) {
        uVar31 = uVar22;
      }
      local_d8 = (uint)""[uVar31] << (bVar14 & 0x1f);
    }
    puVar24 = (ushort *)((core->map).map_edge + ((int)uVar34 >> 2) * iVar4);
    uVar23 = 0;
    while( true ) {
      if ((long)pcVar9->pic_width <= (long)uVar23) break;
      if (iVar7 == 0) {
        uVar33 = (uVar23 & 0xffffffff) >> ((byte)pcVar9->log2_max_cuwh & 0x3f);
        iVar29 = (int)pcVar25[uVar33];
        iVar21 = (int)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff) %
                      (long)pcVar9->max_cuwh);
        if (((uVar23 != 0) && (uVar34 != 0)) && (iVar21 == 0)) {
          iVar26 = (int)pcVar17[uVar33];
          iVar27 = iVar15 + iVar29 + iVar26 >> 1;
          iVar13 = pcVar10->alpha_c_offset;
          uVar30 = iVar27 + iVar13;
          if (0x3e < (int)uVar30) {
            uVar30 = 0x3f;
          }
          uVar18 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar18 = 0;
          }
          local_f4 = (uint)""[uVar18] << (bVar14 & 0x1f);
          iVar32 = pcVar10->beta_offset;
          uVar30 = iVar27 + iVar32;
          if (0x3e < (int)uVar30) {
            uVar30 = 0x3f;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          local_f8 = (uint)""[uVar30] << (bVar14 & 0x1f);
          uVar30 = (iVar29 - iVar8) + (int)pcVar10->chroma_quant_param_delta_cb;
          if (-1 < (int)uVar30) {
            uVar18 = (ulong)uVar30;
            if (0x3e < uVar30) {
              uVar18 = 0x3f;
            }
            uVar30 = (uint)""[uVar18];
          }
          iVar26 = iVar26 - iVar8;
          uVar31 = pcVar10->chroma_quant_param_delta_cb + iVar26;
          if (-1 < (int)uVar31) {
            uVar18 = (ulong)uVar31;
            if (0x3e < uVar31) {
              uVar18 = 0x3f;
            }
            uVar31 = (uint)""[uVar18];
          }
          iVar27 = uVar30 + iVar8;
          uVar30 = 0 << (bVar14 & 0x1f);
          if (iVar27 < 1) {
            iVar27 = 0;
          }
          iVar16 = uVar31 + iVar8;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          iVar27 = (iVar27 + iVar16 + 1U >> 1) - iVar8;
          uVar31 = iVar27 + iVar13;
          if (0x3e < (int)uVar31) {
            uVar31 = 0x3f;
          }
          if ((int)uVar31 < 1) {
            uVar31 = uVar30;
          }
          local_dc = (uint)""[uVar31] << (bVar14 & 0x1f);
          uVar31 = iVar27 + iVar32;
          if (0x3e < (int)uVar31) {
            uVar31 = 0x3f;
          }
          if (0 < (int)uVar31) {
            uVar30 = uVar31;
          }
          local_e0 = (uint)""[uVar30] << (bVar14 & 0x1f);
          uVar30 = (iVar29 - iVar8) + (int)pcVar10->chroma_quant_param_delta_cr;
          if (-1 < (int)uVar30) {
            uVar18 = (ulong)uVar30;
            if (0x3e < uVar30) {
              uVar18 = 0x3f;
            }
            uVar30 = (uint)""[uVar18];
          }
          uVar31 = iVar26 + pcVar10->chroma_quant_param_delta_cr;
          if (-1 < (int)uVar31) {
            uVar18 = (ulong)uVar31;
            if (0x3e < uVar31) {
              uVar18 = 0x3f;
            }
            uVar31 = (uint)""[uVar18];
          }
          iVar27 = uVar30 + iVar8;
          uVar18 = 0;
          if (iVar27 < 1) {
            iVar27 = 0;
          }
          iVar26 = uVar31 + iVar8;
          if (iVar26 < 1) {
            iVar26 = 0;
          }
          iVar27 = (iVar27 + iVar26 + 1U >> 1) - iVar8;
          uVar30 = iVar13 + iVar27;
          if (0x3e < (int)uVar30) {
            uVar30 = 0x3f;
          }
          uVar19 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar19 = uVar18;
          }
          local_e4 = (uint)""[uVar19] << (bVar14 & 0x1f);
          uVar30 = iVar27 + iVar32;
          if (0x3e < (int)uVar30) {
            uVar30 = 0x3f;
          }
          if (0 < (int)uVar30) {
            uVar18 = (ulong)uVar30;
          }
          local_e8 = (uint)""[uVar18] << (bVar14 & 0x1f);
        }
        uVar30 = 0x3f;
        iVar13 = (int)(uVar23 + 8);
        iVar27 = (int)((long)((ulong)(uint)(iVar13 >> 0x1f) << 0x20 | uVar23 + 8 & 0xffffffff) %
                      (long)pcVar9->max_cuwh);
        if (iVar21 == 0 && uVar23 != 0) {
          uVar18 = (ulong)(iVar27 == 0);
        }
        else {
          uVar18 = 1;
          if (pcVar9->pic_width <= iVar13 || iVar27 != 0) goto LAB_00114115;
        }
        iVar13 = iVar15 + iVar29 + (int)pcVar25[uVar18 + uVar33] >> 1;
        iVar21 = pcVar10->alpha_c_offset;
        uVar31 = iVar13 + iVar21;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        uVar19 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          uVar19 = 0;
        }
        local_c4 = (uint)""[uVar19] << (bVar14 & 0x1f);
        iVar27 = pcVar10->beta_offset;
        uVar31 = iVar13 + iVar27;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        local_c8 = (uint)""[uVar31] << (bVar14 & 0x1f);
        uVar31 = (iVar29 - iVar8) + (int)pcVar10->chroma_quant_param_delta_cb;
        if (-1 < (int)uVar31) {
          if (0x3e < uVar31) {
            uVar31 = uVar30;
          }
          uVar31 = (uint)""[uVar31];
        }
        iVar13 = pcVar25[uVar18 + uVar33] - iVar8;
        uVar22 = pcVar10->chroma_quant_param_delta_cb + iVar13;
        if (-1 < (int)uVar22) {
          if (0x3e < uVar22) {
            uVar22 = uVar30;
          }
          uVar22 = (uint)""[uVar22];
        }
        iVar26 = uVar31 + iVar8;
        uVar33 = 0;
        if (iVar26 < 1) {
          iVar26 = 0;
        }
        iVar32 = uVar22 + iVar8;
        if (iVar32 < 1) {
          iVar32 = 0;
        }
        iVar26 = (iVar26 + iVar32 + 1U >> 1) - iVar8;
        uVar31 = iVar26 + iVar21;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        uVar18 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          uVar18 = uVar33;
        }
        local_cc = (uint)""[uVar18] << (bVar14 & 0x1f);
        uVar31 = iVar26 + iVar27;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        if (0 < (int)uVar31) {
          uVar33 = (ulong)uVar31;
        }
        local_d0 = (uint)""[uVar33] << (bVar14 & 0x1f);
        uVar31 = (iVar29 - iVar8) + (int)pcVar10->chroma_quant_param_delta_cr;
        if (-1 < (int)uVar31) {
          if (0x3e < uVar31) {
            uVar31 = uVar30;
          }
          uVar31 = (uint)""[uVar31];
        }
        uVar22 = iVar13 + pcVar10->chroma_quant_param_delta_cr;
        if (-1 < (int)uVar22) {
          if (0x3e < uVar22) {
            uVar22 = uVar30;
          }
          uVar22 = (uint)""[uVar22];
        }
        iVar29 = uVar31 + iVar8;
        uVar33 = 0;
        if (iVar29 < 1) {
          iVar29 = 0;
        }
        iVar13 = uVar22 + iVar8;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        iVar29 = (iVar13 + iVar29 + 1U >> 1) - iVar8;
        uVar31 = iVar21 + iVar29;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        uVar18 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          uVar18 = uVar33;
        }
        local_d4 = (uint)""[uVar18] << (bVar14 & 0x1f);
        uVar31 = iVar29 + iVar27;
        if (0x3e < (int)uVar31) {
          uVar31 = uVar30;
        }
        if (0 < (int)uVar31) {
          uVar33 = (ulong)uVar31;
        }
        local_d8 = (uint)""[uVar33] << (bVar14 & 0x1f);
      }
LAB_00114115:
      uVar2 = CONCAT11(*(undefined1 *)((long)puVar24 + (long)(iVar4 + 2)),(char)puVar24[1]);
      uVar30 = (uint)uVar2 & 0x303;
      if ((((uVar2 & 0x303) != 0) &&
          ((*uavs3d_funs_handle.deblock_luma[0])
                     (local_b8 + uVar23 + 8,iVar5,local_c4,local_c8,uVar30), (uVar23 & 8) != 0)) &&
         ((uVar2 & 0x202) != 0)) {
        (*uavs3d_funs_handle.deblock_chroma[0])
                  (local_c0 + uVar23 + 8,iVar6,local_cc,local_d0,local_d4,local_d8,uVar30);
      }
      uVar2 = *puVar24;
      if ((((uVar2 >> 2 & 0x303) != 0) &&
          ((*uavs3d_funs_handle.deblock_luma[1])(local_b8 + uVar23,iVar5,local_f4,local_f8,0),
          (uVar34 & 0xf) == 0)) && ((uVar2 >> 2 & 0x202) != 0)) {
        (*uavs3d_funs_handle.deblock_chroma[1])
                  (local_c0 + uVar23,iVar6,local_dc,local_e0,local_e4,local_e8,0);
      }
      puVar24 = puVar24 + 1;
      uVar23 = uVar23 + 8;
    }
    local_b8 = local_b8 + (long)iVar5 * 8;
    local_c0 = local_c0 + (long)iVar6 * 4;
    uVar34 = uVar34 + 8;
  } while( true );
}

Assistant:

void com_deblock_lcu_row(com_core_t *core, int lcu_y)
{
    com_seqh_t *seqhdr =  core->seqhdr;
    com_pic_header_t *pichdr =  core->pichdr;
    com_map_t *map   = &core->map;
    com_pic_t * pic  =  core->pic;
    int pix_y, pix_x;
    int i_lcu = seqhdr->pic_width_in_lcu;
    int i_scu = seqhdr->i_scu;
    int s_l = pic->stride_luma;
    int s_c = pic->stride_chroma;
    int shift = seqhdr->bit_depth_internal - 8;
    int alpha_hor_y, beta_hor_y, alpha_ver_y, beta_ver_y;
    int alpha_hor_u, beta_hor_u, alpha_ver_u, beta_ver_u;
    int alpha_hor_v, beta_hor_v, alpha_ver_v, beta_ver_v;
    int fix_qp = pichdr->fixed_picture_qp_flag;
    int pix_start_y = lcu_y * seqhdr->max_cuwh;
    int pix_end_y = COM_MIN(pix_start_y + seqhdr->max_cuwh, seqhdr->pic_height);
    pel *src_l = pic->y + pix_start_y * s_l;
    pel *src_uv = pic->uv + (pix_start_y >> 1) * s_c;
    int qp_offset = seqhdr->bit_depth_2_qp_offset;

    if (fix_qp) {
        int qp = map->map_qp[lcu_y * i_lcu];
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
    }

    for (pix_y = pix_start_y; pix_y < pix_end_y; pix_y += LOOPFILTER_GRID) {
        u8 *edge_flag = map->map_edge + (pix_y >> MIN_CU_LOG2) * i_scu;
        s8 *map_cur = map->map_qp + (pix_y >> seqhdr->log2_max_cuwh) * i_lcu;
        s8 *map_top = map->map_qp + ((pix_y - LOOPFILTER_GRID) >> seqhdr->log2_max_cuwh) * i_lcu;

        if (!fix_qp) {
            int qp_p = map_cur[0];
            if (pix_y) {
                int qp_q = map_top[0];
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
            }
            {
                int qp_q = qp_p;
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
            }
        }
        for (pix_x = 0; pix_x < seqhdr->pic_width; pix_x += LOOPFILTER_GRID) {
            int pix_x_ver = pix_x + LOOPFILTER_GRID;

            if (!fix_qp) {
                s8 *map_qp = map_cur + (pix_x >> seqhdr->log2_max_cuwh);
                int qp_p = map_qp[0];

                if (pix_x % seqhdr->max_cuwh == 0 && pix_x && pix_y) {
                    int qp_q = map_top[pix_x >> seqhdr->log2_max_cuwh];
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
                } 
                if ((pix_x % seqhdr->max_cuwh == 0 && pix_x) || (pix_x_ver % seqhdr->max_cuwh == 0 && pix_x_ver < seqhdr->pic_width)) {
                    int qp_q;
                    if (pix_x_ver % seqhdr->max_cuwh == 0) {
                        qp_q = map_qp[1];
                    } else {
                        qp_q = map_qp[0];
                    }
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
                }
            }

            int edge = ((edge_flag[2]) | ((edge_flag[2 + i_scu]) << 8)) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[0](src_l + pix_x_ver, s_l, alpha_ver_y, beta_ver_y, edge);

                if (pix_x_ver % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[0](src_uv + pix_x_ver, s_c, alpha_ver_u, beta_ver_u, alpha_ver_v, beta_ver_v, edge);
                }
            }
            
            edge = (M16(edge_flag) >> 2) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[1](src_l + pix_x, s_l, alpha_hor_y, beta_hor_y, edge);

                if (pix_y % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[1](src_uv + pix_x, s_c, alpha_hor_u, beta_hor_u, alpha_hor_v, beta_hor_v, edge);
                }
            }
            
            edge_flag += 2;
        }

        src_l  += s_l *  LOOPFILTER_GRID;
        src_uv += s_c * (LOOPFILTER_GRID / 2);
    }
}